

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O1

void predict_or_learn_logistic<false>(boosting *o,single_learner *base,example *ec)

{
  uint64_t *puVar1;
  float fVar2;
  long lVar3;
  float fVar4;
  
  fVar2 = ec->weight;
  if ((float)o->t < 0.0) {
    sqrtf((float)o->t);
  }
  fVar4 = 0.0;
  if (0 < o->N) {
    lVar3 = 0;
    do {
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * (int)lVar3);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)(*(int *)(base + 0xe0) * (int)lVar3);
      fVar4 = fVar4 + (ec->pred).scalar *
                      (o->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 < o->N);
  }
  ec->weight = fVar2;
  ec->partial_prediction = fVar4;
  fVar4 = *(float *)(&DAT_0027a680 + (ulong)(0.0 < fVar4) * 4);
  (ec->pred).scalar = fVar4;
  ec->loss = (float)(~-(uint)(fVar4 == (ec->l).simple.label) & (uint)fVar2);
  return;
}

Assistant:

void predict_or_learn_logistic(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0;

  float s = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;
  float eta = 4.f / sqrtf((float)o.t);

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float w = 1 / (1 + correctedExp(s));

      ec.weight = u * w;

      base.predict(ec, i);
      float z;
      z = ld.label * ec.pred.scalar;

      s += z * o.alpha[i];

      // if ld.label * ec.pred.scalar < 0, learner i made a mistake

      final_prediction += ec.pred.scalar * o.alpha[i];

      // update alpha
      o.alpha[i] += eta * z / (1 + correctedExp(s));
      if (o.alpha[i] > 2.)
        o.alpha[i] = 2;
      if (o.alpha[i] < -2.)
        o.alpha[i] = -2;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      final_prediction += ec.pred.scalar * o.alpha[i];
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}